

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddLinkExtension(cmComputeLinkInformation *this,char *e,LinkType type)

{
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (e == (char *)0x0) {
    return;
  }
  if (*e == '\0') {
    return;
  }
  if (type == LinkShared) {
    std::__cxx11::string::string((string *)&local_30,e,&local_31);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->SharedLinkExtensions,&local_30);
  }
  else {
    if (type != LinkStatic) goto LAB_00342161;
    std::__cxx11::string::string((string *)&local_30,e,&local_31);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->StaticLinkExtensions,&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
LAB_00342161:
  std::__cxx11::string::string((string *)&local_30,e,&local_31);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->LinkExtensions,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmComputeLinkInformation::AddLinkExtension(const char* e, LinkType type)
{
  if (e && *e) {
    if (type == LinkStatic) {
      this->StaticLinkExtensions.push_back(e);
    }
    if (type == LinkShared) {
      this->SharedLinkExtensions.push_back(e);
    }
    this->LinkExtensions.push_back(e);
  }
}